

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_0::ConnectHttpService::connect
          (ConnectHttpService *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined4 in_register_00000034;
  undefined8 *in_stack_00000008;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_98;
  HttpHeaders local_88;
  
  HttpHeaders::HttpHeaders
            (&local_88,*(HttpHeaderTable **)(CONCAT44(in_register_00000034,__fd) + 0x38));
  (**(code **)*in_stack_00000008)(in_stack_00000008,200,"OK",3,&local_88);
  HttpHeaders::~HttpHeaders(&local_88);
  local_98.disposer = (Disposer *)&NullDisposer::instance;
  HttpServer::listenHttp
            ((HttpServer *)this,
             (Own<kj::AsyncIoStream,_std::nullptr_t> *)(CONCAT44(in_register_00000034,__fd) + 0x40))
  ;
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&local_98);
  return (int)this;
}

Assistant:

kj::Promise<void> connect(kj::StringPtr host,
                            const HttpHeaders& headers,
                            kj::AsyncIoStream& connection,
                            ConnectResponse& response,
                            kj::HttpConnectSettings settings) override {
    response.accept(200, "OK", HttpHeaders(tunneledService.table));
    return server.listenHttp(kj::Own<kj::AsyncIoStream>(&connection, kj::NullDisposer::instance));
  }